

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::processMlmNetworkNotification(MlmWrap *this,char *sender,TrodesMsg *msg)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  HFSubConsumer *pHVar5;
  HFSubWorker *pHVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  TrodesMsg m_1;
  string who_1;
  TrodesMsg m;
  string who;
  EventDataType ev_1;
  string origin_1;
  string name;
  EventDataType ev;
  string origin;
  string event;
  binarydata regdata_1;
  HighFreqDataType deregisteredType;
  HFSubWorker *sub_1;
  HFSubConsumer *sub;
  HFSubSockSettings sockInfo;
  binarydata regdata;
  HighFreqDataType registeredType;
  string noteType;
  int rc;
  undefined4 in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff72c;
  HighFreqDataType *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff738;
  network_pimpl *in_stack_fffffffffffff740;
  allocator *paVar7;
  string *in_stack_fffffffffffff750;
  HighFreqDataType *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  undefined1 in_stack_fffffffffffff764;
  undefined1 in_stack_fffffffffffff765;
  undefined1 in_stack_fffffffffffff766;
  undefined1 in_stack_fffffffffffff767;
  TrodesMsg *in_stack_fffffffffffff778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  TrodesMsg *in_stack_fffffffffffff7a0;
  string *in_stack_fffffffffffff7c8;
  network_pimpl *in_stack_fffffffffffff7d0;
  string *in_stack_fffffffffffff7d8;
  TrodesMsg *in_stack_fffffffffffff7e0;
  string local_818 [32];
  string local_7f8 [32];
  EventDataType *in_stack_fffffffffffff828;
  network_pimpl *in_stack_fffffffffffff830;
  MlmWrap *in_stack_fffffffffffff838;
  string *in_stack_fffffffffffff848;
  string *in_stack_fffffffffffff850;
  MlmWrap *in_stack_fffffffffffff858;
  EventDataType *in_stack_fffffffffffff868;
  network_pimpl *in_stack_fffffffffffff870;
  HighFreqDataType *in_stack_fffffffffffff878;
  network_pimpl *in_stack_fffffffffffff880;
  HighFreqDataType *in_stack_fffffffffffff888;
  network_pimpl *in_stack_fffffffffffff890;
  string local_768 [32];
  string local_748 [39];
  allocator local_721;
  string local_720 [24];
  string *in_stack_fffffffffffff8f8;
  string *in_stack_fffffffffffff900;
  MlmWrap *in_stack_fffffffffffff908;
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [104];
  void *in_stack_fffffffffffff9d0;
  HighFreqDataType *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  HighFreqDataType *in_stack_fffffffffffff9e8;
  MlmWrap *in_stack_fffffffffffff9f0;
  string local_5f0 [32];
  string local_5d0 [104];
  string local_568 [32];
  string local_548 [176];
  string local_498 [32];
  string local_478 [39];
  allocator local_451;
  string local_450 [352];
  HFSubWorker *local_2f0;
  HFSubConsumer *local_258;
  string local_250 [32];
  string local_230 [176];
  int local_180;
  string local_168 [32];
  string local_148 [39];
  allocator local_121;
  string local_120 [224];
  string local_40 [36];
  int local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff730,
                          (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
  if (bVar1) {
    HighFreqDataType::HighFreqDataType
              ((HighFreqDataType *)
               CONCAT17(in_stack_fffffffffffff767,
                        CONCAT16(in_stack_fffffffffffff766,
                                 CONCAT15(in_stack_fffffffffffff765,
                                          CONCAT14(in_stack_fffffffffffff764,
                                                   in_stack_fffffffffffff760)))));
    binarydata::binarydata((binarydata *)0x1ffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"n",&local_121);
    TrodesMsg::popcontents<binarydata>
              (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
               (binarydata *)in_stack_fffffffffffff7d0);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    HighFreqDataType::decode
              (in_stack_fffffffffffff730,
               (binarydata *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    network_pimpl::insert_hfdt(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    HighFreqDataType::getName_abi_cxx11_
              ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    HighFreqDataType::getOrigin_abi_cxx11_
              ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    bVar2 = isHfTypeCurrentlySubbed
                      (in_stack_fffffffffffff858,in_stack_fffffffffffff850,in_stack_fffffffffffff848
                      );
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_148);
    if ((bVar2 & 1) != 0) {
      HighFreqDataType::getName_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      HighFreqDataType::getOrigin_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      getSubbedHFSockSettings
                (in_stack_fffffffffffff908,in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_230);
      if (local_180 == 1) {
        HighFreqDataType::HighFreqDataType
                  ((HighFreqDataType *)
                   CONCAT17(in_stack_fffffffffffff767,
                            CONCAT16(in_stack_fffffffffffff766,
                                     CONCAT15(in_stack_fffffffffffff765,
                                              CONCAT14(in_stack_fffffffffffff764,
                                                       in_stack_fffffffffffff760)))),
                   in_stack_fffffffffffff758);
        pHVar5 = createConsumerSub((MlmWrap *)
                                   CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                                   in_stack_fffffffffffff9d8,(size_t)in_stack_fffffffffffff9d0);
        HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffff730);
        local_258 = pHVar5;
        (*(pHVar5->super_HighFreqSub)._vptr_HighFreqSub[2])();
      }
      else if (local_180 == 2) {
        HighFreqDataType::HighFreqDataType
                  ((HighFreqDataType *)
                   CONCAT17(in_stack_fffffffffffff767,
                            CONCAT16(in_stack_fffffffffffff766,
                                     CONCAT15(in_stack_fffffffffffff765,
                                              CONCAT14(in_stack_fffffffffffff764,
                                                       in_stack_fffffffffffff760)))),
                   in_stack_fffffffffffff758);
        pHVar6 = createWorkerSub(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                                 in_stack_fffffffffffff9e4,
                                 (hfs_data_callback_fn)in_stack_fffffffffffff9d8,
                                 in_stack_fffffffffffff9d0);
        HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffff730);
        local_2f0 = pHVar6;
        (*(pHVar6->super_HighFreqSub)._vptr_HighFreqSub[2])();
      }
      HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x1fffa5);
    }
    binarydata::~binarydata((binarydata *)0x1fffc3);
    HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffff730);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff730,
                            (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
    if (bVar1) {
      HighFreqDataType::HighFreqDataType
                ((HighFreqDataType *)
                 CONCAT17(in_stack_fffffffffffff767,
                          CONCAT16(in_stack_fffffffffffff766,
                                   CONCAT15(in_stack_fffffffffffff765,
                                            CONCAT14(in_stack_fffffffffffff764,
                                                     in_stack_fffffffffffff760)))));
      binarydata::binarydata((binarydata *)0x200037);
      paVar7 = &local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_450,"n",paVar7);
      TrodesMsg::popcontents<binarydata>
                (in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
                 (binarydata *)in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      HighFreqDataType::decode
                (in_stack_fffffffffffff730,
                 (binarydata *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      network_pimpl::remove_hfdt(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      HighFreqDataType::getName_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      HighFreqDataType::getOrigin_abi_cxx11_
                ((HighFreqDataType *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728));
      bVar1 = isHfTypeCurrentlySubbed
                        (in_stack_fffffffffffff858,in_stack_fffffffffffff850,
                         in_stack_fffffffffffff848);
      std::__cxx11::string::~string(local_498);
      std::__cxx11::string::~string(local_478);
      if (bVar1) {
        HighFreqDataType::HighFreqDataType
                  ((HighFreqDataType *)
                   CONCAT17(in_stack_fffffffffffff767,
                            CONCAT16(in_stack_fffffffffffff766,
                                     CONCAT15(in_stack_fffffffffffff765,
                                              CONCAT14(in_stack_fffffffffffff764,
                                                       in_stack_fffffffffffff760)))),
                   in_stack_fffffffffffff758);
        local_1c = removeSubFromList(in_stack_fffffffffffff838,
                                     (HighFreqDataType *)in_stack_fffffffffffff830);
        HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffff730);
      }
      binarydata::~binarydata((binarydata *)0x200293);
      HighFreqDataType::~HighFreqDataType(in_stack_fffffffffffff730);
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff730,
                              (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728))
      ;
      if ((bool)uVar3) {
        TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
        TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
        std::__cxx11::string::string(local_5d0,local_548);
        std::__cxx11::string::string(local_5f0,local_568);
        EventDataType::EventDataType
                  ((EventDataType *)
                   CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff766,
                                           CONCAT15(in_stack_fffffffffffff765,
                                                    CONCAT14(in_stack_fffffffffffff764,
                                                             in_stack_fffffffffffff760)))),
                   (string *)in_stack_fffffffffffff758,in_stack_fffffffffffff750);
        std::__cxx11::string::~string(local_5f0);
        std::__cxx11::string::~string(local_5d0);
        network_pimpl::insert_event(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
        EventDataType::~EventDataType((EventDataType *)in_stack_fffffffffffff730);
        std::__cxx11::string::~string(local_568);
        std::__cxx11::string::~string(local_548);
      }
      else {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff730,
                                (char *)CONCAT44(in_stack_fffffffffffff72c,in_stack_fffffffffffff728
                                                ));
        if ((bool)uVar4) {
          TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
          TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
          std::__cxx11::string::string(local_698,(string *)&stack0xfffffffffffff9f0);
          std::__cxx11::string::string(local_6b8,(string *)&stack0xfffffffffffff9d0);
          EventDataType::EventDataType
                    ((EventDataType *)
                     CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffff765,
                                                            CONCAT14(in_stack_fffffffffffff764,
                                                                     in_stack_fffffffffffff760)))),
                     (string *)in_stack_fffffffffffff758,in_stack_fffffffffffff750);
          std::__cxx11::string::~string(local_6b8);
          std::__cxx11::string::~string(local_698);
          network_pimpl::remove_event(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
          EventDataType::~EventDataType((EventDataType *)in_stack_fffffffffffff730);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff9d0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff9f0);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff730,
                                  (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                   in_stack_fffffffffffff728));
          if (bVar1) {
            TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff730,
                                    (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                     in_stack_fffffffffffff728));
            if (((bVar1) &&
                (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff730,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_fffffffffffff72c,
                                                     in_stack_fffffffffffff728)), bVar1)) &&
               (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff730,
                                        (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                         in_stack_fffffffffffff728)), bVar1)) {
              network_pimpl::insert_client(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
            }
            paVar7 = &local_721;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_720,"s",paVar7);
            std::__cxx11::string::string(local_748,local_6d8);
            TrodesMsg::TrodesMsg<std::__cxx11::string>
                      (in_stack_fffffffffffff7a0,
                       (string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                       in_stack_fffffffffffff790);
            std::__cxx11::string::~string(local_748);
            std::__cxx11::string::~string(local_720);
            std::allocator<char>::~allocator((allocator<char> *)&local_721);
            std::__cxx11::string::string(local_768,local_40);
            (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,local_768,&stack0xfffffffffffff900);
            std::__cxx11::string::~string(local_768);
            TrodesMsg::~TrodesMsg((TrodesMsg *)in_stack_fffffffffffff730);
            std::__cxx11::string::~string(local_6d8);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff730,
                                    (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                     in_stack_fffffffffffff728));
            if ((bVar1) ||
               (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffff730,
                                        (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                         in_stack_fffffffffffff728)), bVar1)) {
              TrodesMsg::popstr_abi_cxx11_(in_stack_fffffffffffff778);
              bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffff730,
                                      (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                       in_stack_fffffffffffff728));
              if (((bVar1) &&
                  ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff730,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffff72c,
                                                        in_stack_fffffffffffff728)), bVar1 &&
                   (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff730,
                                            (char *)CONCAT44(in_stack_fffffffffffff72c,
                                                             in_stack_fffffffffffff728)), bVar1))))
                 && (bVar1 = network_pimpl::client_exists
                                       (in_stack_fffffffffffff740,in_stack_fffffffffffff738), bVar1)
                 ) {
                network_pimpl::remove_client(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
              }
              paVar7 = (allocator *)&stack0xfffffffffffff82f;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&stack0xfffffffffffff830,"s",paVar7);
              std::__cxx11::string::string(local_7f8,(string *)&stack0xfffffffffffff878);
              TrodesMsg::TrodesMsg<std::__cxx11::string>
                        (in_stack_fffffffffffff7a0,
                         (string *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                         in_stack_fffffffffffff790);
              std::__cxx11::string::~string(local_7f8);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffff830);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff82f);
              std::__cxx11::string::string(local_818,local_40);
              (**(code **)(*in_RDI + 0x30))(in_RDI,local_10,local_818,&stack0xfffffffffffff850);
              std::__cxx11::string::~string(local_818);
              TrodesMsg::~TrodesMsg((TrodesMsg *)in_stack_fffffffffffff730);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffff878);
            }
            else {
              std::__cxx11::string::string((string *)&stack0xfffffffffffff7c8,local_40);
              local_1c = (**(code **)(*in_RDI + 0x30))
                                   (in_RDI,local_10,&stack0xfffffffffffff7c8,local_18);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffff7c8);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_40);
  return local_1c;
}

Assistant:

int MlmWrap::processMlmNetworkNotification(const char *sender, TrodesMsg &msg) {
    int rc = 0;
    std::string noteType = msg.popstr();
    if (noteType == hfdt_register) { //High Frequency Data Type was registered by *sender
        HighFreqDataType registeredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        registeredType.decode(regdata);
        state->insert_hfdt(registeredType);

        if (isHfTypeCurrentlySubbed(registeredType.getName(), registeredType.getOrigin())) {
            //resub if the module had previously been subbed to this type and the user didn't unsub manually
            HFSubSockSettings sockInfo = getSubbedHFSockSettings(registeredType.getName(), registeredType.getOrigin());

            if (sockInfo.subSockType == HighFreqSub::ST_CONSUMER) {
                HFSubConsumer *sub = createConsumerSub(registeredType, 10);
                sub->initialize();
            }
            else if (sockInfo.subSockType == HighFreqSub::ST_WORKER) {
                HFSubWorker *sub = createWorkerSub(registeredType, 1, sockInfo.userFoo, sockInfo.args);
                sub->initialize();
            }
            //todo: add some way to save the buffer size information
        }
    }
    else if (noteType == hfdt_deregister) { //High Frequency Data Type was deregistered by *sender
        HighFreqDataType deregisteredType;
        binarydata regdata;
        msg.popcontents("n", regdata);
        deregisteredType.decode(regdata);
        state->remove_hfdt(deregisteredType);

        if (isHfTypeCurrentlySubbed(deregisteredType.getName(), deregisteredType.getOrigin())) {
            rc = removeSubFromList(deregisteredType);
        }
    }
    else if(noteType == eventprovide){
        std::string event = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(event, origin);
        state->insert_event(ev);
    }
    else if(noteType == eventunprovide){
        std::string name = msg.popstr();
        std::string origin = msg.popstr();
        EventDataType ev(name, origin);
        state->remove_event(ev);
    }
    else if(noteType == CLIENT_CONNECT_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID){
            state->insert_client(who);
        }
        TrodesMsg m("s", who);
        processNotification(sender, noteType, m);
    }
    else if(noteType == CLIENT_DISCONNECT_MSG || noteType == CLIENT_EXPIRED_MSG){
        std::string who = msg.popstr();
        if(who != TEMP_NETWORK_ID && who != id && who != BROKER_NETWORK_ID && state->client_exists(who)){
            state->remove_client(who);
        }
       TrodesMsg m("s", who);
       processNotification(sender, noteType, m);
    }
    else {
        rc = processNotification(sender, noteType, msg);
    }
    return(rc);
}